

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdftocsv.cpp
# Opt level: O0

void cdftocsv::doit(bool skipheader)

{
  char *pcVar1;
  int *rec_;
  ulong uVar2;
  int recsize;
  int *q;
  char *p;
  bool bSuccess;
  char *pcStack_50;
  int stream_type;
  char *rec;
  int iStack_40;
  int max_recsize;
  size_t total_bins;
  undefined1 local_28 [8];
  vector<damagebindictionary,_std::allocator<damagebindictionary>_> damagebindictionary_vec;
  bool skipheader_local;
  
  damagebindictionary_vec.
  super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = skipheader;
  if (!skipheader) {
    fprintf(_stdout,"event_id,areaperil_id,vulnerability_id,bin_index,prob_to,bin_mean\n");
  }
  std::vector<damagebindictionary,_std::allocator<damagebindictionary>_>::vector
            ((vector<damagebindictionary,_std::allocator<damagebindictionary>_> *)local_28);
  getdamagebindictionary
            ((vector<damagebindictionary,_std::allocator<damagebindictionary>_> *)local_28);
  _iStack_40 = std::vector<damagebindictionary,_std::allocator<damagebindictionary>_>::size
                         ((vector<damagebindictionary,_std::allocator<damagebindictionary>_> *)
                          local_28);
  if (_iStack_40 == 0) {
    _iStack_40 = 10000;
  }
  rec._4_4_ = iStack_40 * 8 + 0x10;
  uVar2 = (ulong)rec._4_4_;
  if ((long)uVar2 < 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pcStack_50 = (char *)operator_new__(uVar2);
  p._4_4_ = 0;
  p._3_1_ = getrec((char *)((long)&p + 4),_stdin,4);
  if (p._4_4_ == 1) {
    while (pcVar1 = pcStack_50, p._3_1_ = getrec(pcStack_50,_stdin,0xc), (bool)p._3_1_) {
      rec_ = (int *)(pcVar1 + 0xc);
      p._3_1_ = getrec((char *)rec_,_stdin,4);
      p._3_1_ = getrec(pcVar1 + 0x10,_stdin,*rec_ * 8);
      processrec(pcStack_50);
    }
    std::vector<damagebindictionary,_std::allocator<damagebindictionary>_>::~vector
              ((vector<damagebindictionary,_std::allocator<damagebindictionary>_> *)local_28);
    return;
  }
  fprintf(_stderr,"FATAL: Invalid stream type %d expect stream type 1\n",(ulong)p._4_4_);
  exit(-1);
}

Assistant:

void doit(bool skipheader)
	{

		if (skipheader == false) fprintf(stdout, "event_id,areaperil_id,vulnerability_id,bin_index,prob_to,bin_mean\n");
		std::vector<damagebindictionary> damagebindictionary_vec;
		getdamagebindictionary(damagebindictionary_vec);
		size_t total_bins = damagebindictionary_vec.size();
		if (total_bins == 0) total_bins = 10000;
		int max_recsize = (int)(total_bins * sizeof(prob_mean)) + sizeof(damagecdfrec) + sizeof(int);

		char *rec = new char[max_recsize];
		int stream_type = 0;

		bool bSuccess = getrec((char *)&stream_type, stdin, sizeof(stream_type));

		if (stream_type != 1) {
			fprintf(stderr, "FATAL: Invalid stream type %d expect stream type 1\n", stream_type);
			exit(-1);
		}
		for (;;) {
			char *p = rec;
			bSuccess = getrec(p, stdin, sizeof(damagecdfrec));
			if (bSuccess == false) break;
			p = p + sizeof(damagecdfrec);
			bSuccess = getrec(p, stdin, sizeof(int)); // we now have bin count
			int *q = (int *)p;
			p = p + sizeof(int);
			int recsize = (*q) * sizeof(prob_mean);
			// we should now have damagecdfrec in memory
			bSuccess = getrec(p, stdin, recsize);
			recsize += sizeof(damagecdfrec) + sizeof(int);

			processrec(rec);
		}
	}